

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall
QL_Manager::Select(QL_Manager *this,int nSelAttrs,RelAttr *selAttrs,int nRelations,char **relations,
                  int nConditions,Condition *conditions)

{
  RC RVar1;
  ostream *poVar2;
  RelCatEntry *pRVar3;
  AttrCatEntry *pAVar4;
  QO_Manager *this_00;
  QO_Rel *relOrder;
  QO_Rel *pQVar5;
  void *pvVar6;
  long lVar7;
  bool bVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar9;
  int local_ec;
  int i_2;
  QO_Rel *qorels;
  QO_Manager *qom;
  float tupleEst;
  float cost;
  QL_Node *topNode;
  _Base_ptr local_c0;
  undefined1 local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_b0;
  allocator local_71;
  undefined1 local_70 [8];
  string relString;
  int local_48;
  int i_1;
  int slot;
  RC rc;
  int i;
  int nConditions_local;
  char **relations_local;
  RelAttr *pRStack_28;
  int nRelations_local;
  RelAttr *selAttrs_local;
  QL_Manager *pQStack_18;
  int nSelAttrs_local;
  QL_Manager *this_local;
  
  i_1 = 0;
  rc = nConditions;
  _i = relations;
  relations_local._4_4_ = nRelations;
  pRStack_28 = selAttrs;
  selAttrs_local._4_4_ = nSelAttrs;
  pQStack_18 = this;
  if ((this->smm->printPageStats & 1U) != 0) {
    SM_Manager::ResetPageStats(this->smm);
  }
  std::operator<<((ostream *)&std::cout,"Select\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   nSelAttrs = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,selAttrs_local._4_4_);
  std::operator<<(poVar2,"\n");
  for (slot = 0; slot < selAttrs_local._4_4_; slot = slot + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"   selAttrs[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,slot);
    poVar2 = std::operator<<(poVar2,"]:");
    poVar2 = operator<<(poVar2,pRStack_28 + slot);
    std::operator<<(poVar2,"\n");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"   nRelations = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,relations_local._4_4_);
  std::operator<<(poVar2,"\n");
  for (slot = 0; slot < relations_local._4_4_; slot = slot + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"   relations[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,slot);
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,_i[slot]);
    std::operator<<(poVar2,"\n");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"   nCondtions = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rc);
  std::operator<<(poVar2,"\n");
  for (slot = 0; slot < rc; slot = slot + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"   conditions[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,slot);
    poVar2 = std::operator<<(poVar2,"]:");
    poVar2 = operator<<(poVar2,conditions + slot);
    std::operator<<(poVar2,"\n");
  }
  i_1 = ParseRelNoDup(this,relations_local._4_4_,_i);
  RVar1 = i_1;
  if (i_1 == 0) {
    Reset(this);
    this->nRels = relations_local._4_4_;
    this->nConds = rc;
    this->condptr = conditions;
    pRVar3 = (RelCatEntry *)malloc((long)relations_local._4_4_ * 0x34);
    this->relEntries = pRVar3;
    memset(this->relEntries,0,0x34);
    i_1 = SM_Manager::GetAllRels
                    (this->smm,this->relEntries,relations_local._4_4_,_i,&this->nAttrs,
                     &this->relToInt);
    if (i_1 == 0) {
      pAVar4 = (AttrCatEntry *)malloc((long)this->nAttrs * 0x54);
      this->attrEntries = pAVar4;
      local_48 = 0;
      for (relString.field_2._12_4_ = 0; (int)relString.field_2._12_4_ < relations_local._4_4_;
          relString.field_2._12_4_ = relString.field_2._12_4_ + 1) {
        pRVar3 = this->relEntries;
        lVar7 = (long)(int)relString.field_2._12_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_70,pRVar3[lVar7].relName,&local_71);
        std::allocator<char>::~allocator((allocator<char> *)&local_71);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_true>
                  (&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   &local_48);
        pVar9 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::insert(&this->relToAttrIndex,&local_b0);
        local_c0 = (_Base_ptr)pVar9.first._M_node;
        local_b8 = pVar9.second;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
        ::~pair(&local_b0);
        i_1 = SM_Manager::GetAttrForRel
                        (this->smm,this->relEntries + (int)relString.field_2._12_4_,
                         this->attrEntries + local_48,&this->attrToRel);
        bVar8 = i_1 == 0;
        if (bVar8) {
          local_48 = this->relEntries[(int)relString.field_2._12_4_].attrCount + local_48;
        }
        else {
          free(this->relEntries);
          free(this->attrEntries);
          this_local._4_4_ = i_1;
        }
        topNode._4_4_ = (uint)!bVar8;
        std::__cxx11::string::~string((string *)local_70);
        if (topNode._4_4_ != 0) {
          return this_local._4_4_;
        }
      }
      i_1 = ParseSelectAttrs(this,selAttrs_local._4_4_,pRStack_28);
      if (i_1 == 0) {
        i_1 = ParseConditions(this,rc,conditions);
        if (i_1 == 0) {
          if ((this->smm->useQO & 1U) == 0) {
            RVar1 = SetUpNodes(this,(QL_Node **)&tupleEst,selAttrs_local._4_4_,pRStack_28);
            if (RVar1 != 0) {
              return RVar1;
            }
            i_1 = 0;
          }
          else {
            this_00 = (QO_Manager *)operator_new(0x48);
            QO_Manager::QO_Manager
                      (this_00,this,this->nRels,this->relEntries,this->nAttrs,this->attrEntries,
                       this->nConds,this->condptr);
            relOrder = (QO_Rel *)malloc((long)this->nRels * 0xc);
            for (local_ec = 0; local_ec < this->nRels; local_ec = local_ec + 1) {
              pQVar5 = relOrder + local_ec;
              pQVar5->relIdx = 0;
              pQVar5->indexAttr = -1;
              pQVar5->indexCond = -1;
            }
            QO_Manager::Compute(this_00,relOrder,(float *)((long)&qom + 4),(float *)&qom);
            QO_Manager::PrintRels(this_00);
            RecalcCondToRel(this,relOrder);
            i_1 = SetUpNodesWithQO(this,(QL_Node **)&tupleEst,relOrder,selAttrs_local._4_4_,
                                   pRStack_28);
            if (i_1 != 0) {
              return i_1;
            }
            if (this_00 != (QO_Manager *)0x0) {
              QO_Manager::~QO_Manager(this_00);
              operator_delete(this_00);
            }
            free(relOrder);
          }
          i_1 = RunSelect(this,_tupleEst);
          RVar1 = i_1;
          if (i_1 == 0) {
            if ((this->smm->useQO & 1U) != 0) {
              poVar2 = std::operator<<((ostream *)&std::cout,"estimated cost: ");
              pvVar6 = (void *)std::ostream::operator<<(poVar2,qom._4_4_);
              std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
              poVar2 = std::operator<<((ostream *)&std::cout,"estimated # tuples: ");
              pvVar6 = (void *)std::ostream::operator<<(poVar2,qom._0_4_);
              std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
            }
            if (bQueryPlans != 0) {
              poVar2 = std::operator<<((ostream *)&std::cout,"PRINTING QUERY PLAN");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              (*_tupleEst->_vptr_QL_Node[5])(_tupleEst,0);
            }
            i_1 = CleanUpNodes(this,_tupleEst);
            RVar1 = i_1;
            if (i_1 == 0) {
              if ((this->smm->printPageStats & 1U) != 0) {
                std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
                SM_Manager::PrintPageStats(this->smm);
              }
              free(this->relEntries);
              free(this->attrEntries);
              this_local._4_4_ = i_1;
              RVar1 = this_local._4_4_;
            }
          }
        }
        else {
          free(this->relEntries);
          free(this->attrEntries);
          this_local._4_4_ = i_1;
          RVar1 = this_local._4_4_;
        }
      }
      else {
        free(this->relEntries);
        free(this->attrEntries);
        this_local._4_4_ = i_1;
        RVar1 = this_local._4_4_;
      }
    }
    else {
      free(this->relEntries);
      this_local._4_4_ = i_1;
      RVar1 = this_local._4_4_;
    }
  }
  this_local._4_4_ = RVar1;
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::Select(int nSelAttrs, const RelAttr selAttrs[],
                      int nRelations, const char * const relations[],
                      int nConditions, const Condition conditions[])
{
  int i;
  RC rc = 0;
  if(smm.printPageStats){
    smm.ResetPageStats();
  }

  cout << "Select\n";

  cout << "   nSelAttrs = " << nSelAttrs << "\n";
  for (i = 0; i < nSelAttrs; i++)
    cout << "   selAttrs[" << i << "]:" << selAttrs[i] << "\n";

  cout << "   nRelations = " << nRelations << "\n";
  for (i = 0; i < nRelations; i++)
    cout << "   relations[" << i << "] " << relations[i] << "\n";

  cout << "   nCondtions = " << nConditions << "\n";
  for (i = 0; i < nConditions; i++)
    cout << "   conditions[" << i << "]:" << conditions[i] << "\n";

  // Parse - relations have no duplicates
  if((rc = ParseRelNoDup(nRelations, relations)))
    return (rc);

  // Reset class query parameters
  Reset();
  nRels = nRelations;
  nConds = nConditions;
  condptr = conditions;

  // retrieve all relations
  relEntries = (RelCatEntry *)malloc(sizeof(RelCatEntry)*nRelations);
  memset((void*)relEntries, 0, sizeof(*relEntries));
  if((rc = smm.GetAllRels(relEntries, nRelations, relations, nAttrs, relToInt))){
    free(relEntries);
    return (rc);
  }

  // Retrieve all attributes
  attrEntries = (AttrCatEntry *)malloc(sizeof(AttrCatEntry)*nAttrs);
  int slot = 0;
  for(int i=0; i < nRelations; i++){
      string relString(relEntries[i].relName);
      relToAttrIndex.insert({relString, slot});
      if((rc = smm.GetAttrForRel(relEntries + i, attrEntries + slot, attrToRel))){
        free(relEntries);
        free(attrEntries);
        return (rc);
      }
      slot += relEntries[i].attrCount;
  }
  
  // Make sure the attributes and conditions are valid
  if((rc = ParseSelectAttrs(nSelAttrs, selAttrs))){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }
  if((rc = ParseConditions(nConditions, conditions))){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }
  /*
  QO_Manager *qom = new QO_Manager(*this, nRels, relEntries, nAttrs, attrEntries,
      nConds, condptr);
  QO_Rel * qorels = (QO_Rel*)(malloc(sizeof(QO_Rel)*nRels));
  for(int i=0; i < nRels; i++){
    *(qorels + i) = (QO_Rel){ 0.0, -1.0, -1.0};
  }
  qom->Compute(qorels);
  qom->PrintRels();
  delete qom;
  free(qorels);
  */
  QL_Node *topNode;
  float cost, tupleEst;
  if(smm.useQO){
    //cout << "using QO" << endl;
    QO_Manager *qom = new QO_Manager(*this, nRels, relEntries, nAttrs, attrEntries,
      nConds, condptr);
    QO_Rel * qorels = (QO_Rel*)(malloc(sizeof(QO_Rel)*nRels));
    for(int i=0; i < nRels; i++){
      *(qorels + i) = (QO_Rel){ 0, -1, -1};
    }
    qom->Compute(qorels, cost, tupleEst);
    qom->PrintRels();
    RecalcCondToRel(qorels);
    if((rc = SetUpNodesWithQO(topNode, qorels, nSelAttrs, selAttrs)))
      return (rc);
    /*
    for(int i=0; i < nRels; i++){
      int index = qorels[i].relIdx;
      cout << relEntries[index].relName << endl;
      cout << "  associated conds: ";
      for(int j=0; j < nConds; j++){
        if(conditionToRel[j] == index)
          cout << j;
        }
        cout << endl;
      }
      */

    delete qom;
    free(qorels);
  }
  else{
    // Construct the query tree
    if((rc = SetUpNodes(topNode, nSelAttrs, selAttrs)))
      return (rc);
  }

  

  //QL_Node *topNode;
  // Construct the query tree
  //if((rc = SetUpNodes(topNode, nSelAttrs, selAttrs)))
  //  return (rc);

  // Print the query tree
  

  
  // run select
  if((rc = RunSelect(topNode)))
    return (rc);

  if(smm.useQO){
    cout << "estimated cost: " << cost << endl;
    cout << "estimated # tuples: " << tupleEst << endl;
  }
    

  if(bQueryPlans){
    cout << "PRINTING QUERY PLAN" <<endl;
    topNode->PrintNode(0);
  }

  
  // clean up query tree
  if((rc = CleanUpNodes(topNode)))
    return (rc);

  if(smm.printPageStats){
    cout << endl;
    smm.PrintPageStats();
  }
    
  free(relEntries);
  free(attrEntries);

  return (rc);
}